

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_sse.c
# Opt level: O0

void itrans_dst7_pb8_sse(s16 *coeff,s16 *block,int shift,int line,int limit_line,int max_tr_val,
                        int min_tr_val,s8 *iT)

{
  s16 sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iStack_4d8;
  int iStack_4d4;
  __m128i v0;
  ulong *local_4c0;
  s8 *pb8;
  __m128i rnd_factor;
  __m128i zero;
  __m128i r1;
  __m128i r0;
  __m128i e2;
  __m128i e1;
  __m128i e0;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i c0;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  int local_3bc;
  int local_3b8;
  int k;
  int j;
  int i;
  int max_tr_val_local;
  int limit_line_local;
  int line_local;
  int shift_local;
  s16 *block_local;
  s16 *coeff_local;
  ushort local_2e8;
  undefined2 uStack_2e6;
  undefined2 uStack_2e4;
  undefined2 uStack_2e2;
  ushort local_2c8;
  undefined2 uStack_2c6;
  undefined2 uStack_2c4;
  undefined2 uStack_2c2;
  ushort local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  ushort local_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  int iStack_1c0;
  int iStack_1bc;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  
  limit_line_local._0_1_ = (char)shift;
  iVar7 = 1 << ((char)limit_line_local - 1U & 0x1f);
  _line_local = (longlong *)block;
  block_local = coeff;
  for (k = 0; k < line; k = k + 1) {
    local_4c0 = (ulong *)iT;
    for (local_3b8 = 0; local_3b8 < 2; local_3b8 = local_3b8 + 1) {
      iStack_4d8 = 0;
      iStack_4d4 = 0;
      v0[0] = 0;
      for (local_3bc = 0; iStack_1c0 = (int)v0[0], iStack_1bc = (int)((ulong)v0[0] >> 0x20),
          local_3bc < 2; local_3bc = local_3bc + 1) {
        sVar1 = *block_local;
        auVar6._2_2_ = sVar1;
        auVar6._0_2_ = sVar1;
        auVar6._4_2_ = sVar1;
        auVar6._6_2_ = sVar1;
        auVar6._10_2_ = sVar1;
        auVar6._8_2_ = sVar1;
        auVar6._12_2_ = sVar1;
        auVar6._14_2_ = sVar1;
        sVar1 = block_local[line];
        auVar4._2_2_ = sVar1;
        auVar4._0_2_ = sVar1;
        auVar4._4_2_ = sVar1;
        auVar4._6_2_ = sVar1;
        auVar4._10_2_ = sVar1;
        auVar4._8_2_ = sVar1;
        auVar4._12_2_ = sVar1;
        auVar4._14_2_ = sVar1;
        sVar1 = block_local[line * 2];
        auVar3._2_2_ = sVar1;
        auVar3._0_2_ = sVar1;
        auVar3._4_2_ = sVar1;
        auVar3._6_2_ = sVar1;
        auVar3._10_2_ = sVar1;
        auVar3._8_2_ = sVar1;
        auVar3._12_2_ = sVar1;
        auVar3._14_2_ = sVar1;
        sVar1 = block_local[line * 3];
        auVar2._2_2_ = sVar1;
        auVar2._0_2_ = sVar1;
        auVar2._4_2_ = sVar1;
        auVar2._6_2_ = sVar1;
        auVar2._10_2_ = sVar1;
        auVar2._8_2_ = sVar1;
        auVar2._12_2_ = sVar1;
        auVar2._14_2_ = sVar1;
        c0[0] = 0;
        c1[1] = *local_4c0;
        auVar8 = pmovsxbw(stack0xfffffffffffffbe8,*local_4c0);
        c1[0] = 0;
        c2[1] = local_4c0[1];
        auVar9 = pmovsxbw(stack0xfffffffffffffbd8,local_4c0[1]);
        c2[0] = 0;
        c3[1] = local_4c0[2];
        auVar10 = pmovsxbw(stack0xfffffffffffffbc8,local_4c0[2]);
        c3[0] = 0;
        e0[1] = local_4c0[3];
        auVar11 = pmovsxbw(stack0xfffffffffffffbb8,local_4c0[3]);
        local_288 = auVar8._0_2_;
        uStack_286 = auVar8._2_2_;
        uStack_284 = auVar8._4_2_;
        uStack_282 = auVar8._6_2_;
        c1[1] = CONCAT26(0,CONCAT24(uStack_286,CONCAT22(0,local_288)));
        c0[0]._0_2_ = uStack_284;
        c0[0]._2_2_ = 0;
        c0[0]._4_2_ = uStack_282;
        local_2a8 = auVar9._0_2_;
        uStack_2a6 = auVar9._2_2_;
        uStack_2a4 = auVar9._4_2_;
        uStack_2a2 = auVar9._6_2_;
        c2[1] = CONCAT26(0,CONCAT24(uStack_2a6,CONCAT22(0,local_2a8)));
        c1[0]._0_2_ = uStack_2a4;
        c1[0]._2_2_ = 0;
        c1[0]._4_2_ = uStack_2a2;
        local_2c8 = auVar10._0_2_;
        uStack_2c6 = auVar10._2_2_;
        uStack_2c4 = auVar10._4_2_;
        uStack_2c2 = auVar10._6_2_;
        c3[1] = CONCAT26(0,CONCAT24(uStack_2c6,CONCAT22(0,local_2c8)));
        c2[0]._0_2_ = uStack_2c4;
        c2[0]._2_2_ = 0;
        c2[0]._4_2_ = uStack_2c2;
        local_2e8 = auVar11._0_2_;
        uStack_2e6 = auVar11._2_2_;
        uStack_2e4 = auVar11._4_2_;
        uStack_2e2 = auVar11._6_2_;
        e0[1] = CONCAT26(0,CONCAT24(uStack_2e6,CONCAT22(0,local_2e8)));
        c3[0]._0_2_ = uStack_2e4;
        c3[0]._2_2_ = 0;
        c3[0]._4_2_ = uStack_2e2;
        auVar5._8_6_ = (int6)c1[2];
        auVar5._0_8_ = c1[1];
        auVar5._14_2_ = 0;
        auVar9 = pmaddwd(auVar6,auVar5);
        auVar11._8_6_ = (int6)c2[2];
        auVar11._0_8_ = c2[1];
        auVar11._14_2_ = 0;
        auVar8 = pmaddwd(auVar4,auVar11);
        local_168 = auVar9._0_4_;
        iStack_164 = auVar9._4_4_;
        iStack_160 = auVar9._8_4_;
        iStack_15c = auVar9._12_4_;
        local_178 = auVar8._0_4_;
        iStack_174 = auVar8._4_4_;
        iStack_170 = auVar8._8_4_;
        iStack_16c = auVar8._12_4_;
        auVar10._8_6_ = (int6)c3[2];
        auVar10._0_8_ = c3[1];
        auVar10._14_2_ = 0;
        auVar10 = pmaddwd(auVar3,auVar10);
        auVar9._8_6_ = (int6)e0[2];
        auVar9._0_8_ = e0[1];
        auVar9._14_2_ = 0;
        auVar8 = pmaddwd(auVar2,auVar9);
        local_188 = auVar10._0_4_;
        iStack_184 = auVar10._4_4_;
        iStack_180 = auVar10._8_4_;
        iStack_17c = auVar10._12_4_;
        local_198 = auVar8._0_4_;
        iStack_194 = auVar8._4_4_;
        iStack_190 = auVar8._8_4_;
        iStack_18c = auVar8._12_4_;
        iStack_4d8 = iStack_4d8 + local_168 + local_178 + local_188 + local_198;
        iStack_4d4 = iStack_4d4 + iStack_164 + iStack_174 + iStack_184 + iStack_194;
        v0[0] = CONCAT44(iStack_1bc + iStack_15c + iStack_16c + iStack_17c + iStack_18c,
                         iStack_1c0 + iStack_160 + iStack_170 + iStack_180 + iStack_190);
        local_4c0 = local_4c0 + 4;
        block_local = block_local + (line << 2);
      }
      auVar9 = ZEXT416((uint)shift);
      auVar8._4_4_ = iStack_4d4 + iVar7 >> auVar9;
      auVar8._0_4_ = iStack_4d8 + iVar7 >> auVar9;
      auVar8._8_4_ = iStack_1c0 + iVar7 >> auVar9;
      auVar8._12_4_ = iStack_1bc + iVar7 >> auVar9;
      auVar8 = packssdw(auVar8,ZEXT816(0));
      zero[1] = auVar8._0_8_;
      *_line_local = zero[1];
      block_local = block_local + -(long)(line << 3);
      local_4c0 = (ulong *)((long)local_4c0 + -0x3c);
      _line_local = _line_local + 1;
    }
    block_local = block_local + 1;
  }
  return;
}

Assistant:

void itrans_dst7_pb8_sse(s16 *coeff, s16 *block, int shift, int line, int limit_line, int max_tr_val, int min_tr_val, s8 *iT)
{
    int i, j, k;
    __m128i s0, s1, s2, s3;
    __m128i c0, c1, c2, c3;
    __m128i e0, e1, e2;
    __m128i r0, r1;
    __m128i zero = _mm_setzero_si128();
    __m128i rnd_factor = _mm_set1_epi32(1 << (shift - 1));
    for (i = 0; i < line; i++)
    {
        s8 *pb8 = iT;
        for (j = 0; j < 2; j++)
        {
            __m128i v0 = zero;
            for (k = 0; k < 2; k++)
            {
                //load src
                s0 = _mm_set1_epi16(coeff[0]);
                s1 = _mm_set1_epi16(coeff[line]);
                s2 = _mm_set1_epi16(coeff[2 * line]);
                s3 = _mm_set1_epi16(coeff[3 * line]);

                c0 = _mm_loadl_epi64((__m128i*)pb8);
                c0 = _mm_cvtepi8_epi16(c0);
                c1 = _mm_loadl_epi64((__m128i*)(pb8 + 8));
                c1 = _mm_cvtepi8_epi16(c1);
                c2 = _mm_loadl_epi64((__m128i*)(pb8 + 16));
                c2 = _mm_cvtepi8_epi16(c2);
                c3 = _mm_loadl_epi64((__m128i*)(pb8 + 24));
                c3 = _mm_cvtepi8_epi16(c3);
                c0 = _mm_unpacklo_epi16(c0, zero);
                c1 = _mm_unpacklo_epi16(c1, zero);
                c2 = _mm_unpacklo_epi16(c2, zero);
                c3 = _mm_unpacklo_epi16(c3, zero);

                e0 = _mm_add_epi32(_mm_madd_epi16(s0, c0), _mm_madd_epi16(s1, c1));
                e1 = _mm_add_epi32(_mm_madd_epi16(s2, c2), _mm_madd_epi16(s3, c3));
                e2 = _mm_add_epi32(e0, e1);

                v0 = _mm_add_epi32(v0, e2);

                pb8 += 32;
                coeff += (4 * line);
            }
            r0 = _mm_add_epi32(v0, rnd_factor);
            r1 = _mm_packs_epi32(_mm_srai_epi32(r0, shift), zero);
            _mm_storel_epi64((__m128i*)block, r1);
            coeff -= (8 * line);
            pb8 -= 60;
            block += 4;
        }
        coeff++;
    }
}